

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_hashtable_expand(arg_hashtable_t *h)

{
  arg_hashtable_entry *paVar1;
  uint uVar2;
  uint uVar3;
  arg_hashtable_entry **__s;
  double dVar4;
  uint local_30;
  uint index;
  uint i;
  uint newsize;
  arg_hashtable_entry *e;
  arg_hashtable_entry **newtable;
  arg_hashtable_t *h_local;
  
  if (h->primeindex == 0x19) {
    h_local._4_4_ = 0;
  }
  else {
    uVar2 = h->primeindex + 1;
    h->primeindex = uVar2;
    uVar2 = primes[uVar2];
    __s = (arg_hashtable_entry **)argtable3_xmalloc((ulong)uVar2 << 3);
    memset(__s,0,(ulong)uVar2 << 3);
    for (local_30 = 0; local_30 < h->tablelength; local_30 = local_30 + 1) {
      while (paVar1 = h->table[local_30], paVar1 != (arg_hashtable_entry *)0x0) {
        h->table[local_30] = paVar1->next;
        uVar3 = index_for(uVar2,paVar1->h);
        paVar1->next = __s[uVar3];
        __s[uVar3] = paVar1;
      }
    }
    argtable3_xfree(h->table);
    h->table = __s;
    h->tablelength = uVar2;
    dVar4 = ceil((double)uVar2 * 0.6499999761581421);
    h->loadlimit = (uint)(long)dVar4;
    h_local._4_4_ = -1;
  }
  return h_local._4_4_;
}

Assistant:

static int arg_hashtable_expand(arg_hashtable_t* h) {
    /* Double the size of the table to accommodate more entries */
    struct arg_hashtable_entry** newtable;
    struct arg_hashtable_entry* e;
    unsigned int newsize;
    unsigned int i;
    unsigned int index;

    /* Check we're not hitting max capacity */
    if (h->primeindex == (prime_table_length - 1))
        return 0;
    newsize = primes[++(h->primeindex)];

    newtable = (struct arg_hashtable_entry**)xmalloc(sizeof(struct arg_hashtable_entry*) * newsize);
    memset(newtable, 0, newsize * sizeof(struct arg_hashtable_entry*));
    /*
     * This algorithm is not 'stable': it reverses the list
     * when it transfers entries between the tables
     */
    for (i = 0; i < h->tablelength; i++) {
        while (NULL != (e = h->table[i])) {
            h->table[i] = e->next;
            index = index_for(newsize, e->h);
            e->next = newtable[index];
            newtable[index] = e;
        }
    }

    xfree(h->table);
    h->table = newtable;
    h->tablelength = newsize;
    h->loadlimit = (unsigned int)ceil(newsize * (double)max_load_factor);
    return -1;
}